

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void sexp_release_object(sexp_conflict ctx,sexp_conflict x)

{
  sexp_conflict *ppsVar1;
  sexp_mark_stack_ptr_t *psVar2;
  sexp_conflict *ppsVar3;
  sexp_mark_stack_ptr_t *psVar4;
  
  psVar2 = (((ctx->value).type.setters)->value).context.mark_stack + 8;
  ppsVar3 = (sexp_conflict *)0x0;
  psVar4 = psVar2;
  while( true ) {
    ppsVar1 = psVar4->start;
    if (((ulong)ppsVar1 & 3) != 0) {
      return;
    }
    if (*(int *)ppsVar1 != 6) break;
    if (ppsVar1[1] == x) {
      psVar4 = (sexp_mark_stack_ptr_t *)(ppsVar3 + 2);
      if (ppsVar3 == (sexp_conflict *)0x0) {
        psVar4 = psVar2;
      }
      psVar4->start = (sexp_conflict *)ppsVar1[2];
      return;
    }
    psVar4 = (sexp_mark_stack_ptr_t *)(ppsVar1 + 2);
    ppsVar3 = ppsVar1;
  }
  return;
}

Assistant:

void sexp_release_object(sexp ctx, sexp x) {
  sexp ls1, ls2;
  for (ls1=NULL, ls2=sexp_global(ctx, SEXP_G_PRESERVATIVES); sexp_pairp(ls2);
       ls1=ls2, ls2=sexp_cdr(ls2))
    if (sexp_car(ls2) == x) {
      if (ls1) sexp_cdr(ls1) = sexp_cdr(ls2);
      else sexp_global(ctx, SEXP_G_PRESERVATIVES) = sexp_cdr(ls2);
      break;
    }
}